

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  Bitset *pBVar5;
  uint *itr;
  bool *itr_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0 [32];
  _Node_iterator_base<unsigned_int,_false> local_680;
  undefined1 local_678;
  value_type local_66c;
  uint local_668;
  uint local_664;
  uint32_t i_1;
  uint32_t consumed_locations;
  uint32_t local_63c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638 [32];
  undefined1 local_618 [8];
  SPIRType decl_type;
  ExecutionModel local_4b4;
  spirv_cross local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [36];
  uint32_t local_46c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [32];
  spirv_cross local_448 [32];
  undefined1 local_428 [40];
  string effective_semantic;
  undefined1 local_3e8 [8];
  SPIRType newtype;
  uint32_t i;
  undefined1 local_270 [8];
  string semantic;
  ExecutionModel local_244;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [4];
  uint32_t location_number;
  string name;
  anon_class_8_1_33ba97e3 local_220;
  anon_class_8_1_33ba97e3 get_vacant_location;
  TypedID<(spirv_cross::Types)0> *local_210;
  spirv_cross local_208 [38];
  char local_1e2;
  allocator local_1e1;
  string local_1e0 [36];
  uint32_t local_1bc;
  uint32_t local_1b8;
  uint32_t location;
  uint32_t local_1a4;
  uint32_t local_1a0;
  byte local_19b;
  byte local_19a;
  byte local_199;
  uint32_t index;
  bool legacy;
  bool need_matrix_unroll;
  bool use_location_number;
  string binding;
  undefined1 local_178 [8];
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRType::SPIRType((SPIRType *)local_178,pSVar3);
  ::std::__cxx11::string::string((string *)&index);
  local_199 = 1;
  local_19a = 0;
  local_19b = (this->hlsl_options).shader_model < 0x1f;
  if ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 4) &&
     (var->storage == StorageClassOutput)) {
    local_1a4 = (var->super_IVariant).self.id;
    local_1a0 = Compiler::get_decoration((Compiler *)this,(ID)local_1a4,DecorationIndex);
    local_1bc = (var->super_IVariant).self.id;
    local_1b8 = Compiler::get_decoration((Compiler *)this,(ID)local_1bc,DecorationLocation);
    if ((local_1a0 != 0) && (local_1b8 != 0)) {
      local_1e2 = '\x01';
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1e0,"Dual-source blending is only supported on MRT #0 in HLSL.",&local_1e1);
      CompilerError::CompilerError(pCVar4,(string *)local_1e0);
      local_1e2 = '\0';
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_210 = (TypedID<(spirv_cross::Types)0> *)0x5ec131;
    if ((local_19b & 1) != 0) {
      local_210 = (TypedID<(spirv_cross::Types)0> *)0x5ec12b;
    }
    get_vacant_location.active_locations._4_4_ = local_1b8 + local_1a0;
    join<char_const*,unsigned_int>
              (local_208,(char **)&local_210,
               (uint *)((long)&get_vacant_location.active_locations + 4));
    ::std::__cxx11::string::operator=((string *)&index,(string *)local_208);
    ::std::__cxx11::string::~string((string *)local_208);
    local_199 = 0;
    if ((local_19b & 1) != 0) {
      type.super_IVariant._12_4_ = 4;
    }
  }
  else if ((var->storage == StorageClassInput) &&
          ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0 &&
           (local_19a = 1, (bool)local_19b)))) {
    type.super_IVariant._vptr_IVariant._4_4_ = 0xd;
  }
  local_220.active_locations = active_locations;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_240,this,(ulong)uVar2,1);
  if ((local_199 & 1) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (local_6a0,this,local_178,local_240,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_6a0,(char (*) [4])0x5f15c7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
               (char (*) [2])0x5e9b70);
    ::std::__cxx11::string::~string((string *)local_6a0);
  }
  else {
    bVar1 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (bVar1) {
      local_244 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    }
    else {
      local_244 = emit_interface_block_in_struct::anon_class_8_1_33ba97e3::operator()(&local_220);
    }
    to_semantic_abi_cxx11_
              ((CompilerHLSL *)local_270,(uint32_t)this,local_244,
               *(StorageClass *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt);
    if (((local_19a & 1) == 0) || (type.width < 2)) {
      SPIRType::SPIRType((SPIRType *)local_618,(SPIRType *)local_178);
      if (*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0x14f5) {
        itr = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&decl_type.columns);
        SmallVector<unsigned_int,_8UL>::erase
                  ((SmallVector<unsigned_int,_8UL> *)&decl_type.columns,itr);
        itr_00 = VectorView<bool>::begin
                           ((VectorView<bool> *)(decl_type.array.stack_storage.aligned_char + 0x18))
        ;
        SmallVector<bool,_8UL>::erase
                  ((SmallVector<bool,_8UL> *)(decl_type.array.stack_storage.aligned_char + 0x18),
                   itr_00);
      }
      local_63c = (var->super_IVariant).self.id;
      pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_63c);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])(local_638,this,pBVar5);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (&i_1,this,local_618,local_240,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,local_638,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                 (char (*) [4])0x5f15c7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                 (char (*) [2])0x5e9b70);
      ::std::__cxx11::string::~string((string *)&i_1);
      ::std::__cxx11::string::~string((string *)local_638);
      local_664 = type_to_consumed_locations(this,(SPIRType *)local_618);
      for (local_668 = 0; local_668 < local_664; local_668 = local_668 + 1) {
        local_66c = local_244 + local_668;
        pVar6 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_66c);
        local_680._M_cur =
             (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_678 = pVar6.second;
      }
      SPIRType::~SPIRType((SPIRType *)local_618);
    }
    else {
      bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)&type.columns);
      if (!bVar1) {
        newtype.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&i,"Arrays of matrices used as input/output. This is not supported.",
                   (allocator *)((long)&newtype.member_name_cache._M_h._M_single_bucket + 7));
        CompilerError::CompilerError(pCVar4,(string *)&i);
        newtype.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      for (newtype.member_name_cache._M_h._M_single_bucket._0_4_ = 0;
          (uint)newtype.member_name_cache._M_h._M_single_bucket < type.width;
          newtype.member_name_cache._M_h._M_single_bucket._0_4_ =
               (uint)newtype.member_name_cache._M_h._M_single_bucket + 1) {
        SPIRType::SPIRType((SPIRType *)local_3e8,(SPIRType *)local_178);
        newtype.width = 1;
        ::std::__cxx11::string::string((string *)(local_428 + 0x20));
        if (((this->hlsl_options).flatten_matrix_vertex_input_semantics & 1U) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                    (local_448,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                     (char (*) [2])0x5eeb74,(uint *)&newtype.member_name_cache._M_h._M_single_bucket
                    );
          ::std::__cxx11::string::operator=((string *)(local_428 + 0x20),(string *)local_448);
          ::std::__cxx11::string::~string((string *)local_448);
        }
        else {
          to_semantic_abi_cxx11_
                    ((CompilerHLSL *)local_428,(uint32_t)this,local_244,
                     *(StorageClass *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt);
          ::std::__cxx11::string::operator=((string *)(local_428 + 0x20),(string *)local_428);
          ::std::__cxx11::string::~string((string *)local_428);
        }
        local_46c = (var->super_IVariant).self.id;
        pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_46c);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])(local_468,this,pBVar5);
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (local_4b0,local_240,(char (*) [2])0x5eeb74,
                   (uint *)&newtype.member_name_cache._M_h._M_single_bucket);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (local_490,this,local_3e8,local_4b0,0);
        CompilerGLSL::
        statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,local_468,local_490,(char (*) [4])0x5f15c7,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_428 + 0x20),(char (*) [2])0x5e9b70);
        ::std::__cxx11::string::~string((string *)local_490);
        ::std::__cxx11::string::~string((string *)local_4b0);
        ::std::__cxx11::string::~string((string *)local_468);
        local_4b4 = local_244;
        pVar6 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_4b4);
        decl_type.member_name_cache._M_h._M_single_bucket =
             (__node_base_ptr)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        ::std::__cxx11::string::~string((string *)(local_428 + 0x20));
        SPIRType::~SPIRType((SPIRType *)local_3e8);
        local_244 = local_244 + ExecutionModelTessellationControl;
      }
    }
    ::std::__cxx11::string::~string((string *)local_270);
  }
  ::std::__cxx11::string::~string((string *)local_240);
  ::std::__cxx11::string::~string((string *)&index);
  SPIRType::~SPIRType((SPIRType *)local_178);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool need_matrix_unroll = false;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}
	else if (var.storage == StorageClassInput && execution.model == ExecutionModelVertex)
	{
		need_matrix_unroll = true;
		if (legacy) // Inputs must be floating-point in legacy targets.
			type.basetype = SPIRType::Float;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (has_decoration(var.self, DecorationLocation))
			location_number = get_decoration(var.self, DecorationLocation);
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;

				string effective_semantic;
				if (hlsl_options.flatten_matrix_vertex_input_semantics)
					effective_semantic = to_semantic(location_number, execution.model, var.storage);
				else
					effective_semantic = join(semantic, "_", i);

				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", effective_semantic, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			auto decl_type = type;
			if (execution.model == ExecutionModelMeshEXT)
			{
				decl_type.array.erase(decl_type.array.begin());
				decl_type.array_size_literal.erase(decl_type.array_size_literal.begin());
			}
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(decl_type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(decl_type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
	{
		statement(variable_decl(type, name), " : ", binding, ";");
	}
}